

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PluginRegistry.cpp
# Opt level: O0

void Rml::PluginRegistry::NotifyElementCreate(Element *element)

{
  bool bVar1;
  PluginVectors *pPVar2;
  reference ppPVar3;
  Plugin *plugin;
  iterator __end1;
  iterator __begin1;
  Vector<Plugin_*> *__range1;
  Element *element_local;
  
  pPVar2 = ControlledLifetimeResource<Rml::PluginVectors>::operator->
                     ((ControlledLifetimeResource<Rml::PluginVectors> *)plugin_vectors);
  __end1 = ::std::vector<Rml::Plugin_*,_std::allocator<Rml::Plugin_*>_>::begin(&pPVar2->element);
  plugin = (Plugin *)
           ::std::vector<Rml::Plugin_*,_std::allocator<Rml::Plugin_*>_>::end(&pPVar2->element);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Rml::Plugin_**,_std::vector<Rml::Plugin_*,_std::allocator<Rml::Plugin_*>_>_>
                                *)&plugin);
    if (!bVar1) break;
    ppPVar3 = __gnu_cxx::
              __normal_iterator<Rml::Plugin_**,_std::vector<Rml::Plugin_*,_std::allocator<Rml::Plugin_*>_>_>
              ::operator*(&__end1);
    (*(*ppPVar3)->_vptr_Plugin[10])(*ppPVar3,element);
    __gnu_cxx::
    __normal_iterator<Rml::Plugin_**,_std::vector<Rml::Plugin_*,_std::allocator<Rml::Plugin_*>_>_>::
    operator++(&__end1);
  }
  return;
}

Assistant:

void PluginRegistry::NotifyElementCreate(Element* element)
{
	for (Plugin* plugin : plugin_vectors->element)
		plugin->OnElementCreate(element);
}